

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O1

int socket_server_poll(socket_server *ss,socket_message *result,int *more)

{
  __fd_mask *p_Var1;
  byte bVar2;
  uint16_t uVar3;
  short sVar4;
  void *pvVar5;
  uintptr_t uVar6;
  bool bVar7;
  undefined2 uVar8;
  char cVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  ssize_t sVar13;
  char *pcVar14;
  ulong uVar15;
  socket *psVar16;
  socket *psVar17;
  uintptr_t *puVar18;
  char *pcVar19;
  int *piVar20;
  event *peVar21;
  int iVar22;
  _Bool *p_Var23;
  long lVar24;
  uint8_t *udp_address;
  ushort uVar25;
  int unaff_R12D;
  addrinfo *paVar26;
  bool bVar27;
  addrinfo *ai_list;
  sockaddr_all u;
  socklen_t len;
  uint8_t buffer [256];
  byte local_3e2;
  byte local_3e1;
  socket *local_3e0;
  char *local_3d8;
  addrinfo *local_3d0;
  undefined1 local_3c4 [12];
  ulong local_3b8;
  event *local_3b0;
  undefined1 local_3a8 [8];
  epoll_data_t eStack_3a0;
  undefined8 local_398;
  sockaddr *psStack_390;
  char *local_388;
  addrinfo *paStack_380;
  uint8_t *local_370;
  socklen_t local_368 [6];
  _Bool *local_350;
  int *local_348;
  fd_set *local_340;
  request_send local_338;
  undefined4 local_328;
  undefined4 uStack_324;
  
  local_340 = &ss->rfds;
  local_3e0 = ss->slot;
  local_3d8 = ss->buffer;
  local_3b0 = ss->ev;
  local_370 = ss->udpbuffer;
  local_350 = &ss->ev[0].write;
  pcVar14 = local_3d8;
  local_348 = more;
  do {
    while (ss->checkctrl == 0) {
LAB_0010fe5b:
      if (ss->event_index == ss->event_n) {
        uVar11 = epoll_wait(ss->event_fd,(epoll_event *)&local_338,0x40,-1);
        if (0 < (int)uVar11) {
          lVar24 = 0;
          p_Var23 = local_350;
          do {
            ((event *)(p_Var23 + -9))->s = *(void **)((long)&local_338.sz + lVar24);
            bVar2 = *(byte *)((long)&local_338.id + lVar24);
            *p_Var23 = (_Bool)(bVar2 >> 2 & 1);
            p_Var23[-1] = (_Bool)(bVar2 & 1);
            lVar24 = lVar24 + 0xc;
            p_Var23 = p_Var23 + 0x10;
          } while ((ulong)uVar11 * 0xc != lVar24);
        }
        ss->event_n = uVar11;
        ss->checkctrl = 1;
        if (local_348 != (int *)0x0) {
          *local_348 = 0;
        }
        ss->event_index = 0;
        if (ss->event_n < 1) {
          ss->event_n = 0;
          return -1;
        }
      }
      peVar21 = local_3b0;
      iVar10 = ss->event_index;
      ss->event_index = iVar10 + 1;
      psVar17 = (socket *)local_3b0[iVar10].s;
      if (psVar17 == (socket *)0x0) {
        cVar9 = '\x03';
      }
      else {
        uVar3 = psVar17->type;
        if (uVar3 == 3) {
          local_368[0] = 0x1c;
          iVar10 = accept(psVar17->fd,(sockaddr *)local_3a8,local_368);
          if (iVar10 < 0) {
            piVar20 = __errno_location();
            bVar27 = true;
            if (*piVar20 - 0x17U < 2) {
              result->opaque = psVar17->opaque;
              result->id = psVar17->id;
              result->ud = 0;
              pcVar19 = strerror(*piVar20);
              result->data = pcVar19;
              bVar7 = false;
            }
            else {
              bVar7 = true;
            }
          }
          else {
            iVar12 = reserve_id(ss);
            if (-1 < iVar12) {
              local_338.id._0_2_ = 1;
              local_338.id._2_2_ = 0;
              setsockopt(iVar10,1,9,&local_338,4);
              sp_nonblocking(iVar10);
              psVar16 = new_fd(ss,iVar12,iVar10,0,psVar17->opaque,false);
              uVar8 = local_3a8._2_2_;
              if (psVar16 != (socket *)0x0) {
                psVar16->type = 7;
                result->opaque = psVar17->opaque;
                result->id = psVar17->id;
                result->ud = iVar12;
                result->data = (char *)0x0;
                pcVar19 = inet_ntop((uint)(ushort)local_3a8._0_2_,
                                    local_3a8 + (ulong)((ushort)local_3a8._0_2_ != 2) * 4 + 4,
                                    (char *)&local_338,0x2e);
                pcVar14 = local_3d8;
                if (pcVar19 != (char *)0x0) {
                  snprintf(local_3d8,0x80,"%s:%d",&local_338,
                           (ulong)(ushort)(uVar8 << 8 | (ushort)uVar8 >> 8));
                  result->data = pcVar14;
                }
                bVar7 = true;
                bVar27 = false;
                goto LAB_001106ca;
              }
            }
            close(iVar10);
            bVar27 = true;
            bVar7 = true;
            pcVar14 = local_3d8;
          }
LAB_001106ca:
          if (!bVar7) {
            unaff_R12D = 4;
          }
          if (!bVar27) {
            unaff_R12D = 3;
          }
          if ((bool)(bVar7 & bVar27)) goto LAB_00110a8b;
          cVar9 = '\x01';
        }
        else if (uVar3 == 4) {
          local_368[0] = 4;
          iVar10 = getsockopt(psVar17->fd,1,4,local_3a8,local_368);
          if ((iVar10 < 0) || (CONCAT22(local_3a8._2_2_,local_3a8._0_2_) != 0)) {
            force_close(ss,psVar17,result);
            piVar20 = __errno_location();
            pcVar19 = strerror(*piVar20);
            result->data = pcVar19;
            unaff_R12D = 4;
          }
          else {
            psVar17->type = 5;
            result->opaque = psVar17->opaque;
            result->id = psVar17->id;
            result->ud = 0;
            if (((psVar17->high).head == (write_buffer *)0x0) &&
               ((psVar17->low).head == (write_buffer *)0x0)) {
              local_338.id._0_2_ = 1;
              local_338.id._2_2_ = 0;
              local_338.sz._0_1_ = (byte)psVar17;
              local_338.sz._1_2_ = (undefined2)((ulong)psVar17 >> 8);
              local_338._7_4_ = SUB84((ulong)psVar17 >> 0x18,0);
              local_338.buffer._3_1_ = (undefined1)((ulong)psVar17 >> 0x38);
              epoll_ctl(ss->event_fd,3,psVar17->fd,(epoll_event *)&local_338);
            }
            local_3c4._0_4_ = 0x1c;
            iVar10 = getpeername(psVar17->fd,(sockaddr *)&local_338,(socklen_t *)local_3c4);
            if (iVar10 == 0) {
              pcVar19 = inet_ntop((uint)(ushort)local_338.id,
                                  &local_338.sz + ((ushort)local_338.id != 2),pcVar14,0x80);
              if (pcVar19 == (char *)0x0) goto LAB_001101ba;
              result->data = pcVar14;
            }
            else {
LAB_001101ba:
              result->data = (char *)0x0;
            }
            unaff_R12D = 2;
          }
          cVar9 = '\x01';
        }
        else {
          if (uVar3 == 0) {
            socket_server_poll_cold_1();
          }
          else if (local_3b0[iVar10].read == true) {
            if (psVar17->protocol == 0) {
              iVar12 = (psVar17->p).size;
              local_3b8 = CONCAT44(local_3b8._4_4_,iVar12);
              pcVar14 = (char *)malloc((long)iVar12);
              sVar13 = read(psVar17->fd,pcVar14,(long)iVar12);
              iVar12 = (int)sVar13;
              if (iVar12 < 0) {
                free(pcVar14);
                piVar20 = __errno_location();
                iVar12 = -1;
                if (*piVar20 != 4) {
                  if (*piVar20 == 0xb) {
                    socket_server_poll_cold_2();
                  }
                  else {
                    force_close(ss,psVar17,result);
                    pcVar14 = strerror(*piVar20);
                    result->data = pcVar14;
                    iVar12 = 4;
                  }
                }
              }
              else if (iVar12 == 0) {
                free(pcVar14);
                force_close(ss,psVar17,result);
                iVar12 = 1;
              }
              else if (psVar17->type == 6) {
                free(pcVar14);
                iVar12 = -1;
              }
              else {
                if ((undefined4)local_3b8 == iVar12) {
                  iVar22 = (psVar17->p).size * 2;
LAB_00110a32:
                  (psVar17->p).size = iVar22;
                }
                else if ((0x40 < (int)(undefined4)local_3b8) &&
                        (iVar12 * 2 < (int)(undefined4)local_3b8)) {
                  iVar22 = (psVar17->p).size / 2;
                  goto LAB_00110a32;
                }
                result->opaque = psVar17->opaque;
                result->id = psVar17->id;
                result->ud = iVar12;
                result->data = pcVar14;
                iVar12 = 0;
              }
LAB_00110a4d:
              if (peVar21[iVar10].write == true) {
                if ((iVar12 == 1) || (iVar12 == 4)) goto LAB_00110a70;
                peVar21[iVar10].read = false;
                ss->event_index = ss->event_index + -1;
              }
              if (iVar12 != -1) goto LAB_00110a70;
              cVar9 = '\x04';
              bVar27 = true;
            }
            else {
              local_3a8._0_2_ = 0x1c;
              local_3a8._2_2_ = 0;
              sVar13 = recvfrom(psVar17->fd,local_370,0xffff,0,(sockaddr *)&local_338,
                                (socklen_t *)local_3a8);
              uVar11 = (uint)sVar13;
              if ((int)uVar11 < 0) {
                piVar20 = __errno_location();
                iVar12 = -1;
                bVar27 = false;
                if ((*piVar20 != 4) && (*piVar20 != 0xb)) {
                  force_close(ss,psVar17,result);
                  pcVar14 = strerror(*piVar20);
                  result->data = pcVar14;
                  iVar12 = 4;
LAB_0011084b:
                  bVar27 = false;
                }
              }
              else {
                if (CONCAT22(local_3a8._2_2_,local_3a8._0_2_) == 0x10) {
                  if (psVar17->protocol != 1) {
LAB_00110845:
                    iVar12 = -1;
                    goto LAB_0011084b;
                  }
                  pcVar14 = (char *)malloc((ulong)(uVar11 + 7));
                  uVar15 = (ulong)(uVar11 & 0x7fffffff);
                  pcVar14[uVar15] = '\x01';
                  *(undefined2 *)(pcVar14 + uVar15 + 1) = local_338.id._2_2_;
                  *(uint *)(pcVar14 + uVar15 + 3) =
                       CONCAT13(local_338.sz._3_1_,CONCAT21(local_338.sz._1_2_,(byte)local_338.sz));
                }
                else {
                  if (psVar17->protocol != 2) goto LAB_00110845;
                  pcVar14 = (char *)malloc((ulong)(uVar11 + 0x13));
                  uVar15 = (ulong)(uVar11 & 0x7fffffff);
                  pcVar14[uVar15] = '\x02';
                  *(undefined2 *)(pcVar14 + uVar15 + 1) = local_338.id._2_2_;
                  *(ulong *)(pcVar14 + uVar15 + 3) =
                       CONCAT44(local_338.buffer._4_4_,
                                CONCAT13(local_338.buffer._3_1_,local_338.buffer._0_3_));
                  *(ulong *)(pcVar14 + uVar15 + 3 + 8) = CONCAT44(uStack_324,local_328);
                }
                memcpy(pcVar14,local_370,(ulong)(uVar11 & 0x7fffffff));
                result->opaque = psVar17->opaque;
                result->id = psVar17->id;
                result->ud = uVar11;
                result->data = pcVar14;
                iVar12 = 6;
                bVar27 = true;
              }
              if (!bVar27) goto LAB_00110a4d;
              ss->event_index = ss->event_index + -1;
              iVar12 = 6;
LAB_00110a70:
              cVar9 = '\x01';
              bVar27 = false;
              unaff_R12D = iVar12;
            }
            pcVar14 = local_3d8;
            if (!bVar27) goto LAB_00110a8d;
          }
          else if (local_3b0[iVar10].write == true) {
            iVar10 = send_buffer(ss,psVar17,result);
            if (iVar10 != -1) {
              cVar9 = (iVar10 == -1) * '\x03' + '\x01';
              unaff_R12D = iVar10;
              goto LAB_00110a8d;
            }
          }
LAB_00110a8b:
          cVar9 = '\0';
        }
      }
LAB_00110a8d:
      if (cVar9 == '\x01') {
        return unaff_R12D;
      }
    }
    local_338.id._0_2_ = 0;
    local_338.id._2_2_ = 0;
    local_338.sz._0_1_ = 0;
    local_338.sz._1_2_ = 0;
    local_338._7_4_ = 0;
    local_338.buffer._3_1_ = 0;
    local_338.buffer._4_4_ = 0;
    iVar10 = ss->recvctrl_fd;
    iVar12 = iVar10 + 0x3f;
    if (-1 < iVar10) {
      iVar12 = iVar10;
    }
    p_Var1 = (ss->rfds).__fds_bits + (iVar12 >> 6);
    *p_Var1 = *p_Var1 | 1L << ((byte)(iVar10 % 0x40) & 0x3f);
    iVar10 = select(iVar10 + 1,(fd_set *)local_340,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&local_338
                   );
    if (iVar10 != 1) {
      ss->checkctrl = 0;
      goto LAB_0010fe5b;
    }
    iVar10 = ss->recvctrl_fd;
    block_readpipe(iVar10,&local_3e2,2);
    bVar2 = local_3e2;
    uVar15 = (ulong)local_3e2;
    block_readpipe(iVar10,&local_338,(uint)local_3e1);
    uVar25 = (ushort)local_338.id;
    switch(bVar2) {
    case 0x41:
      iVar10 = 0;
      udp_address = (uint8_t *)&local_328;
      goto LAB_001103e5;
    case 0x42:
      result->id = CONCAT22(local_338.id._2_2_,(ushort)local_338.id);
      uVar6 = CONCAT44(local_338.buffer._4_4_,
                       CONCAT13(local_338.buffer._3_1_,local_338.buffer._0_3_));
      result->opaque = uVar6;
      result->ud = 0;
      psVar17 = new_fd(ss,CONCAT22(local_338.id._2_2_,(ushort)local_338.id),
                       CONCAT13(local_338.sz._3_1_,CONCAT21(local_338.sz._1_2_,(byte)local_338.sz)),
                       0,uVar6,true);
      if (psVar17 == (socket *)0x0) {
        pcVar14 = "reach skynet socket number limit";
        goto LAB_00110c1b;
      }
      sp_nonblocking(CONCAT13(local_338.sz._3_1_,CONCAT21(local_338.sz._1_2_,(byte)local_338.sz)));
      psVar17->type = 8;
      pcVar14 = "binding";
LAB_0011033b:
      result->data = pcVar14;
LAB_0011033f:
      iVar10 = 2;
      break;
    case 0x43:
      iVar10 = -1;
      if (*(short *)((long)&local_3e0->type + (ulong)((uint)(ushort)local_338.id * 0x50)) != 0) {
        puVar18 = (uintptr_t *)
                  ((long)&local_3e0->opaque + (ulong)((uint)(ushort)local_338.id * 0x50));
        iVar12 = *(int *)((long)puVar18 + 0x34);
        if (iVar12 == CONCAT22(local_338.id._2_2_,(ushort)local_338.id)) {
          if ((ushort)puVar18[7] != (ushort)(byte)local_338.sz) {
            result->opaque = *puVar18;
            result->id = iVar12;
            result->ud = 0;
            pcVar14 = "protocol mismatch";
            goto LAB_00110c1b;
          }
          if ((byte)local_338.sz == 1) {
            *(undefined4 *)((long)puVar18 + 0x3f) = local_338._7_4_;
            *(undefined4 *)((long)puVar18 + 0x3c) =
                 CONCAT13(local_338.sz._3_1_,CONCAT21(local_338.sz._1_2_,1));
          }
          else {
            *(uint *)((long)puVar18 + 0x4b) = CONCAT31((undefined3)uStack_324,local_328._3_1_);
            *(undefined4 *)((long)puVar18 + 0x3c) =
                 CONCAT13(local_338.sz._3_1_,CONCAT21(local_338.sz._1_2_,(byte)local_338.sz));
            *(uint *)(puVar18 + 8) = CONCAT13(local_338.buffer._3_1_,local_338.buffer._0_3_);
            *(undefined4 *)((long)puVar18 + 0x44) = local_338.buffer._4_4_;
            *(undefined4 *)(puVar18 + 9) = local_328;
          }
        }
      }
      break;
    case 0x44:
      iVar10 = 0;
      goto LAB_001103e2;
    default:
      fprintf(_stderr,"socket-server: Unknown ctrl %c.\n",uVar15);
      goto LAB_00110886;
    case 0x4b:
      iVar12 = CONCAT22(local_338.id._2_2_,(ushort)local_338.id);
      if ((*(short *)((long)&local_3e0->type + (ulong)((uint)(ushort)local_338.id * 0x50)) == 0) ||
         (psVar17 = (socket *)
                    ((long)&local_3e0->opaque + (ulong)((uint)(ushort)local_338.id * 0x50)),
         psVar17->id != iVar12)) {
        result->id = iVar12;
        result->opaque =
             CONCAT44(local_338.buffer._4_4_,CONCAT13(local_338.buffer._3_1_,local_338.buffer._0_3_)
                     );
        result->ud = 0;
        result->data = (char *)0x0;
      }
      else {
        if (((psVar17->high).head != (write_buffer *)0x0) ||
           ((psVar17->low).head != (write_buffer *)0x0)) {
          iVar10 = send_buffer(ss,psVar17,result);
          if (iVar10 != -1) break;
        }
        if (((psVar17->high).head != (write_buffer *)0x0) ||
           ((psVar17->low).head != (write_buffer *)0x0)) {
          psVar17->type = 6;
          goto LAB_00110886;
        }
        force_close(ss,psVar17,result);
        result->id = iVar12;
        result->opaque =
             CONCAT44(local_338.buffer._4_4_,CONCAT13(local_338.buffer._3_1_,local_338.buffer._0_3_)
                     );
      }
      iVar10 = 1;
      break;
    case 0x4c:
      iVar10 = CONCAT22(local_338.id._2_2_,(ushort)local_338.id);
      iVar12 = CONCAT13(local_338.sz._3_1_,CONCAT21(local_338.sz._1_2_,(byte)local_338.sz));
      psVar17 = new_fd(ss,iVar10,iVar12,0,
                       CONCAT44(local_338.buffer._4_4_,
                                CONCAT13(local_338.buffer._3_1_,local_338.buffer._0_3_)),false);
      if (psVar17 == (socket *)0x0) {
        close(iVar12);
        result->opaque =
             CONCAT44(local_338.buffer._4_4_,CONCAT13(local_338.buffer._3_1_,local_338.buffer._0_3_)
                     );
        result->id = iVar10;
        result->ud = 0;
        result->data = "reach skynet socket number limit";
        goto LAB_00110b91;
      }
      psVar17->type = 2;
      goto LAB_00110886;
    case 0x4f:
      uVar15 = (ulong)CONCAT22(local_338.id._2_2_,(ushort)local_338.id);
      result->opaque =
           CONCAT44(local_338.buffer._4_4_,CONCAT13(local_338.buffer._3_1_,local_338.buffer._0_3_));
      result->id = CONCAT22(local_338.id._2_2_,(ushort)local_338.id);
      result->ud = 0;
      result->data = (char *)0x0;
      local_3d0 = (addrinfo *)0x0;
      sprintf((char *)local_368,"%d",
              (ulong)CONCAT13(local_338.sz._3_1_,CONCAT21(local_338.sz._1_2_,(byte)local_338.sz)));
      local_3a8._0_2_ = 0;
      local_3a8._2_2_ = 0;
      local_3a8._4_4_ = 0;
      local_398._0_4_ = 0;
      local_398._4_4_ = 0;
      psStack_390 = (sockaddr *)0x0;
      local_388 = (char *)0x0;
      paStack_380 = (addrinfo *)0x0;
      eStack_3a0.fd = 1;
      eStack_3a0.u64._4_4_ = 6;
      iVar10 = getaddrinfo((char *)&local_328,(char *)local_368,(addrinfo *)local_3a8,&local_3d0);
      if (iVar10 == 0) {
        paVar26 = local_3d0;
        if (local_3d0 == (addrinfo *)0x0) {
          bVar27 = true;
          iVar10 = -1;
        }
        else {
          iVar12 = 0;
          local_3b8 = uVar15;
          do {
            iVar10 = socket(paVar26->ai_family,paVar26->ai_socktype,paVar26->ai_protocol);
            if (-1 < iVar10) {
              local_3c4._0_4_ = 1;
              setsockopt(iVar10,1,9,local_3c4,4);
              sp_nonblocking(iVar10);
              iVar12 = connect(iVar10,paVar26->ai_addr,paVar26->ai_addrlen);
              if (iVar12 == 0) {
                iVar12 = 0;
                break;
              }
              piVar20 = __errno_location();
              if (*piVar20 == 0x73) {
                iVar12 = 1;
                break;
              }
              close(iVar10);
              iVar10 = -1;
            }
            paVar26 = paVar26->ai_next;
          } while (paVar26 != (addrinfo *)0x0);
          bVar27 = iVar12 == 0;
          uVar15 = local_3b8;
        }
        if (iVar10 < 0) {
          piVar20 = __errno_location();
          pcVar14 = strerror(*piVar20);
        }
        else {
          psVar17 = new_fd(ss,(int)uVar15,iVar10,0,
                           CONCAT44(local_338.buffer._4_4_,
                                    CONCAT13(local_338.buffer._3_1_,local_338.buffer._0_3_)),true);
          pcVar14 = local_3d8;
          if (psVar17 != (socket *)0x0) {
            if (!bVar27) {
              psVar17->type = 4;
              local_3c4._0_4_ = 5;
              local_3c4._4_8_ = psVar17;
              epoll_ctl(ss->event_fd,3,psVar17->fd,(epoll_event *)local_3c4);
              freeaddrinfo(local_3d0);
              iVar10 = -1;
              break;
            }
            psVar17->type = 5;
            pcVar19 = inet_ntop(paVar26->ai_family,
                                paVar26->ai_addr->sa_data + (ulong)(paVar26->ai_family != 2) * 4 + 2
                                ,local_3d8,0x80);
            if (pcVar19 != (char *)0x0) {
              result->data = pcVar14;
            }
            freeaddrinfo(local_3d0);
            goto LAB_0011033f;
          }
          close(iVar10);
          pcVar14 = "reach skynet socket number limit";
        }
      }
      else {
        pcVar14 = gai_strerror(iVar10);
      }
      result->data = pcVar14;
      freeaddrinfo(local_3d0);
      uVar25 = (ushort)uVar15;
LAB_00110b91:
      *(undefined2 *)((long)&local_3e0->type + (ulong)((uint)uVar25 * 0x50)) = 0;
      goto LAB_00110c1f;
    case 0x50:
      iVar10 = 1;
LAB_001103e2:
      udp_address = (uint8_t *)0x0;
LAB_001103e5:
      iVar10 = send_socket(ss,&local_338,result,iVar10,udp_address);
      break;
    case 0x53:
      result->id = CONCAT22(local_338.id._2_2_,(ushort)local_338.id);
      uVar6 = CONCAT44(local_338.buffer._4_4_,
                       CONCAT13(local_338.buffer._3_1_,local_338.buffer._0_3_));
      result->opaque = uVar6;
      result->ud = 0;
      result->data = (char *)0x0;
      sVar4 = *(short *)((long)&local_3e0->type + (ulong)((uint)(ushort)local_338.id * 0x50));
      if ((sVar4 == 0) ||
         (puVar18 = (uintptr_t *)
                    ((long)&local_3e0->opaque + (ulong)((uint)(ushort)local_338.id * 0x50)),
         *(int *)((long)puVar18 + 0x34) != CONCAT22(local_338.id._2_2_,(ushort)local_338.id))) {
        pcVar14 = "invalid socket";
      }
      else {
        if (sVar4 != 7) {
          if (sVar4 == 5) {
            *puVar18 = uVar6;
            pcVar14 = "transfer";
            goto LAB_0011033b;
          }
          iVar10 = -1;
          if (sVar4 != 2) break;
        }
        local_3a8._0_2_ = 1;
        local_3a8._2_2_ = 0;
        unique0x10001780 = puVar18;
        iVar10 = epoll_ctl(ss->event_fd,1,(int)puVar18[6],(epoll_event *)local_3a8);
        if (iVar10 != -1) {
          bVar27 = *(short *)((long)puVar18 + 0x3a) == 7;
          *(ushort *)((long)puVar18 + 0x3a) = bVar27 + 3 + (ushort)bVar27;
          *puVar18 = CONCAT44(local_338.buffer._4_4_,
                              CONCAT13(local_338.buffer._3_1_,local_338.buffer._0_3_));
          pcVar14 = "start";
          goto LAB_0011033b;
        }
        *(undefined2 *)((long)puVar18 + 0x3a) = 0;
        piVar20 = __errno_location();
        pcVar14 = strerror(*piVar20);
      }
LAB_00110c1b:
      result->data = pcVar14;
LAB_00110c1f:
      iVar10 = 4;
      break;
    case 0x54:
      uVar15 = (ulong)((uint)(ushort)local_338.id * 0x50);
      iVar10 = -1;
      if ((*(short *)((long)&local_3e0->type + uVar15) != 0) &&
         (*(int *)((long)&local_3e0->id + uVar15) ==
          CONCAT22(local_338.id._2_2_,(ushort)local_338.id))) {
        local_3a8._0_2_ = local_338.buffer._0_2_;
        local_3a8._2_2_ =
             (undefined2)(CONCAT13(local_338.buffer._3_1_,local_338.buffer._0_3_) >> 0x10);
        setsockopt(*(int *)((long)&local_3e0->fd + uVar15),6,
                   CONCAT13(local_338.sz._3_1_,CONCAT21(local_338.sz._1_2_,(byte)local_338.sz)),
                   local_3a8,4);
      }
      break;
    case 0x55:
      psVar17 = new_fd(ss,CONCAT22(local_338.id._2_2_,(ushort)local_338.id),
                       CONCAT13(local_338.sz._3_1_,CONCAT21(local_338.sz._1_2_,(byte)local_338.sz)),
                       (CONCAT13(local_338.buffer._3_1_,local_338.buffer._0_3_) == 10) + 1,
                       CONCAT44(uStack_324,local_328),true);
      if (psVar17 == (socket *)0x0) {
        close(CONCAT13(local_338.sz._3_1_,CONCAT21(local_338.sz._1_2_,(byte)local_338.sz)));
        *(undefined2 *)((long)&local_3e0->type + (ulong)((uint)uVar25 * 0x50)) = 0;
      }
      else {
        psVar17->type = 5;
        *(undefined8 *)&psVar17->p = 0;
        *(undefined8 *)((long)&psVar17->p + 8) = 0;
        *(undefined4 *)((long)&psVar17->p + 0xf) = 0;
      }
LAB_00110886:
      iVar10 = -1;
      break;
    case 0x58:
      result->opaque = 0;
      result->id = 0;
      result->ud = 0;
      result->data = (char *)0x0;
      iVar10 = 5;
    }
    if (iVar10 == -1) {
      bVar27 = false;
    }
    else {
      if ((iVar10 == 4) || (iVar10 == 1)) {
        iVar12 = ss->event_index;
        if (iVar12 < ss->event_n) {
          iVar22 = ss->event_n - iVar12;
          peVar21 = local_3b0 + iVar12;
          do {
            pvVar5 = peVar21->s;
            if (((pvVar5 != (void *)0x0) && (*(short *)((long)pvVar5 + 0x3a) == 0)) &&
               (*(int *)((long)pvVar5 + 0x34) == result->id)) {
              peVar21->s = (void *)0x0;
              break;
            }
            peVar21 = peVar21 + 1;
            iVar22 = iVar22 + -1;
          } while (iVar22 != 0);
        }
      }
      bVar27 = true;
      unaff_R12D = iVar10;
    }
    pcVar14 = local_3d8;
    if (bVar27) {
      return unaff_R12D;
    }
  } while( true );
}

Assistant:

int 
socket_server_poll(struct socket_server *ss, struct socket_message * result, int * more) {
	for (;;) {
		if (ss->checkctrl) {
			if (has_cmd(ss)) {
				int type = ctrl_cmd(ss, result);
				if (type != -1) {
					clear_closed_event(ss, result, type);
					return type;
				} else
					continue;
			} else {
				ss->checkctrl = 0;
			}
		}
		if (ss->event_index == ss->event_n) {
			ss->event_n = sp_wait(ss->event_fd, ss->ev, MAX_EVENT);
			ss->checkctrl = 1;
			if (more) {
				*more = 0;
			}
			ss->event_index = 0;
			if (ss->event_n <= 0) {
				ss->event_n = 0;
				return -1;
			}
		}
		struct event *e = &ss->ev[ss->event_index++];
		struct socket *s = e->s;
		if (s == NULL) {
			// dispatch pipe message at beginning
			continue;
		}
		switch (s->type) {
		case SOCKET_TYPE_CONNECTING:
			return report_connect(ss, s, result);
		case SOCKET_TYPE_LISTEN: {
			int ok = report_accept(ss, s, result);
			if (ok > 0) {
				return SOCKET_ACCEPT;
			} if (ok < 0 ) {
				return SOCKET_ERROR;
			}
			// when ok == 0, retry
			break;
		}
		case SOCKET_TYPE_INVALID:
			fprintf(stderr, "socket-server: invalid socket\n");
			break;
		default:
			if (e->read) {
				int type;
				if (s->protocol == PROTOCOL_TCP) {
					type = forward_message_tcp(ss, s, result);
				} else {
					type = forward_message_udp(ss, s, result);
					if (type == SOCKET_UDP) {
						// try read again
						--ss->event_index;
						return SOCKET_UDP;
					}
				}
				if (e->write && type != SOCKET_CLOSE && type != SOCKET_ERROR) {
					// Try to dispatch write message next step if write flag set.
					e->read = false;
					--ss->event_index;
				}
				if (type == -1)
					break;				
				return type;
			}
			if (e->write) {
				int type = send_buffer(ss, s, result);
				if (type == -1)
					break;
				return type;
			}
			break;
		}
	}
}